

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyboard.cpp
# Opt level: O3

char event_to_ascii(uint8_t scancode,uint8_t modifiers)

{
  char cVar1;
  char cVar2;
  undefined7 in_register_00000039;
  bool bVar3;
  
  switch((int)CONCAT71(in_register_00000039,scancode)) {
  case 1:
    return '\x1b';
  case 2:
    return -0x7b;
  case 3:
    return -0x7a;
  case 4:
    return -0x79;
  case 5:
    return -0x78;
  case 6:
    return -0x77;
  case 7:
    return -0x76;
  case 8:
    return -0x75;
  case 9:
    return -0x74;
  case 10:
    bVar3 = (modifiers & 1) == 0;
    cVar1 = '`';
    cVar2 = '~';
    break;
  case 0xb:
    return ((modifiers & 1) == 0) << 4 | 0x21;
  case 0xc:
    bVar3 = (modifiers & 1) == 0;
    cVar1 = '2';
    cVar2 = '@';
    break;
  case 0xd:
    return ((modifiers & 1) == 0) << 4 | 0x23;
  case 0xe:
    return ((modifiers & 1) == 0) << 4 | 0x24;
  case 0xf:
    return ((modifiers & 1) == 0) << 4 | 0x25;
  case 0x10:
    bVar3 = (modifiers & 1) == 0;
    cVar1 = '6';
    cVar2 = '^';
    break;
  case 0x11:
    bVar3 = (modifiers & 1) == 0;
    cVar1 = '7';
    cVar2 = '&';
    break;
  case 0x12:
    bVar3 = (modifiers & 1) == 0;
    cVar1 = '8';
    cVar2 = '*';
    break;
  case 0x13:
    cVar2 = '\x12';
    if ((modifiers & 2) == 0) {
      cVar2 = '9';
    }
    cVar1 = '(';
    goto LAB_00112d5b;
  case 0x14:
    cVar2 = -0x6e;
    if ((modifiers & 2) == 0) {
      cVar2 = '0';
    }
    cVar1 = ')';
LAB_00112d5b:
    if ((modifiers & 1) == 0) {
      cVar1 = cVar2;
    }
    return cVar1;
  case 0x15:
    bVar3 = (modifiers & 1) == 0;
    cVar1 = '-';
    cVar2 = '_';
    break;
  case 0x16:
    bVar3 = (modifiers & 1) == 0;
    cVar1 = '=';
    cVar2 = '+';
    break;
  case 0x17:
    return '\b';
  case 0x18:
  case 0x3f:
    return ' ';
  case 0x19:
    return ((modifiers & 1) == 0) << 5 | 0x51;
  case 0x1a:
    return ((modifiers & 1) == 0) << 5 | 0x57;
  case 0x1b:
    return ((modifiers & 1) == 0) << 5 | 0x45;
  case 0x1c:
    return ((modifiers & 1) == 0) << 5 | 0x52;
  case 0x1d:
    return ((modifiers & 1) == 0) << 5 | 0x54;
  case 0x1e:
    return ((modifiers & 1) == 0) << 5 | 0x59;
  case 0x1f:
    return ((modifiers & 1) == 0) << 5 | 0x55;
  case 0x20:
    return ((modifiers & 1) == 0) << 5 | 0x49;
  case 0x21:
    return ((modifiers & 1) == 0) << 5 | 0x4f;
  case 0x22:
    return ((modifiers & 1) == 0) << 5 | 0x50;
  case 0x23:
    return (modifiers & 1) << 5 | 0x5b;
  case 0x24:
    return (modifiers & 1) << 5 | 0x5d;
  case 0x25:
    return '\n';
  case 0x26:
    return ((modifiers & 1) == 0) << 5 | 0x41;
  case 0x27:
    return ((modifiers & 1) == 0) << 5 | 0x53;
  case 0x28:
    return ((modifiers & 1) == 0) << 5 | 0x44;
  case 0x29:
    return ((modifiers & 1) == 0) << 5 | 0x46;
  case 0x2a:
    return ((modifiers & 1) == 0) << 5 | 0x47;
  case 0x2b:
    return ((modifiers & 1) == 0) << 5 | 0x48;
  case 0x2c:
    return ((modifiers & 1) == 0) << 5 | 0x4a;
  case 0x2d:
    return ((modifiers & 1) == 0) << 5 | 0x4b;
  case 0x2e:
    return ((modifiers & 1) == 0) << 5 | 0x4c;
  case 0x2f:
    return modifiers & 1 ^ 0x3b;
  case 0x30:
    return ((modifiers & 1) == 0) * '\x05' + '\"';
  case 0x31:
    return (modifiers & 1) << 5 | 0x5c;
  default:
    return '\0';
  case 0x33:
    return ((modifiers & 1) == 0) << 5 | 0x5a;
  case 0x34:
    return ((modifiers & 1) == 0) << 5 | 0x58;
  case 0x35:
    return ((modifiers & 1) == 0) << 5 | 0x43;
  case 0x36:
    return ((modifiers & 1) == 0) << 5 | 0x56;
  case 0x37:
    return ((modifiers & 1) == 0) << 5 | 0x42;
  case 0x38:
    return ((modifiers & 1) == 0) << 5 | 0x4e;
  case 0x39:
    return ((modifiers & 1) == 0) << 5 | 0x4d;
  case 0x3a:
    return (modifiers & 1) << 4 | 0x2c;
  case 0x3b:
    return (modifiers & 1) << 4 | 0x2e;
  case 0x3c:
    return (modifiers & 1) << 4 | 0x2f;
  case 0x41:
    return -99;
  case 0x42:
    return -0x6f;
  case 0x43:
    return '\x11';
  case 0x44:
    return '\x1d';
  }
  if (bVar3) {
    cVar2 = cVar1;
  }
  return cVar2;
}

Assistant:

inline char event_to_ascii(uint8_t scancode, uint8_t modifiers)
{
	using namespace E64;
	
	switch (scancode) {
		case SCANCODE_ESCAPE: return ASCII_ESCAPE;
		case SCANCODE_F1:     return ASCII_F1;
		case SCANCODE_F2:     return ASCII_F2;
		case SCANCODE_F3:     return ASCII_F3;
		case SCANCODE_F4:     return ASCII_F4;
		case SCANCODE_F5:     return ASCII_F5;
		case SCANCODE_F6:     return ASCII_F6;
		case SCANCODE_F7:     return ASCII_F7;
		case SCANCODE_F8:     return ASCII_F8;
		case SCANCODE_GRAVE:  return (modifiers & SHIFT_PRESSED) ? ASCII_TILDE : ASCII_GRAVE;
		case SCANCODE_1:      return (modifiers & SHIFT_PRESSED) ? ASCII_EXCL_MARK : ASCII_1;
		case SCANCODE_2:      return (modifiers & SHIFT_PRESSED) ? ASCII_AT : ASCII_2;
		case SCANCODE_3:      return (modifiers & SHIFT_PRESSED) ? ASCII_NUMBER : ASCII_3;
		case SCANCODE_4:      return (modifiers & SHIFT_PRESSED) ? ASCII_DOLLAR : ASCII_4;
		case SCANCODE_5:      return (modifiers & SHIFT_PRESSED) ? ASCII_PERCENT : ASCII_5;
		case SCANCODE_6:      return (modifiers & SHIFT_PRESSED) ? ASCII_CARET : ASCII_6;
		case SCANCODE_7:      return (modifiers & SHIFT_PRESSED) ? ASCII_AMPERSAND : ASCII_7;
		case SCANCODE_8:      return (modifiers & SHIFT_PRESSED) ? ASCII_ASTERISK : ASCII_8;
		case SCANCODE_9:      return (modifiers & SHIFT_PRESSED) ? ASCII_OPEN_PAR : ((modifiers & CTRL_PRESSED) ? ASCII_REVERSE_ON : ASCII_9);
		case SCANCODE_0:      return (modifiers & SHIFT_PRESSED) ? ASCII_CLOSE_PAR : ((modifiers & CTRL_PRESSED) ? ASCII_REVERSE_OFF : ASCII_0);
		case SCANCODE_MINUS:  return (modifiers & SHIFT_PRESSED) ? ASCII_UNDERSCORE : ASCII_HYPHEN;
		case SCANCODE_EQUALS: return (modifiers & SHIFT_PRESSED) ? ASCII_PLUS : ASCII_EQUALS;
		case SCANCODE_BACKSPACE: return ASCII_BACKSPACE;
		case SCANCODE_TAB:    return ASCII_SPACE;	// TODO: temp hack to make things work
		case SCANCODE_Q:      return (modifiers & SHIFT_PRESSED) ? ASCII_Q : ASCII_q;
		case SCANCODE_W:      return (modifiers & SHIFT_PRESSED) ? ASCII_W : ASCII_w;
		case SCANCODE_E:      return (modifiers & SHIFT_PRESSED) ? ASCII_E : ASCII_e;
		case SCANCODE_R:      return (modifiers & SHIFT_PRESSED) ? ASCII_R : ASCII_r;
		case SCANCODE_T:      return (modifiers & SHIFT_PRESSED) ? ASCII_T : ASCII_t;
		case SCANCODE_Y:      return (modifiers & SHIFT_PRESSED) ? ASCII_Y : ASCII_y;
		case SCANCODE_U:      return (modifiers & SHIFT_PRESSED) ? ASCII_U : ASCII_u;
		case SCANCODE_I:      return (modifiers & SHIFT_PRESSED) ? ASCII_I : ASCII_i;
		case SCANCODE_O:      return (modifiers & SHIFT_PRESSED) ? ASCII_O : ASCII_o;
		case SCANCODE_P:      return (modifiers & SHIFT_PRESSED) ? ASCII_P : ASCII_p;
		case SCANCODE_LEFTBRACKET: return (modifiers & SHIFT_PRESSED) ? ASCII_OPEN_BRACE : ASCII_OPEN_BRACK;
		case SCANCODE_RIGHTBRACKET: return (modifiers & SHIFT_PRESSED) ? ASCII_CLOSE_BRACE : ASCII_CLOSE_BRACK;
		case SCANCODE_RETURN: return ASCII_LF;
		case SCANCODE_A:      return (modifiers & SHIFT_PRESSED) ? ASCII_A : ASCII_a;
		case SCANCODE_S:      return (modifiers & SHIFT_PRESSED) ? ASCII_S : ASCII_s;
		case SCANCODE_D:      return (modifiers & SHIFT_PRESSED) ? ASCII_D : ASCII_d;
		case SCANCODE_F:      return (modifiers & SHIFT_PRESSED) ? ASCII_F : ASCII_f;
		case SCANCODE_G:      return (modifiers & SHIFT_PRESSED) ? ASCII_G : ASCII_g;
		case SCANCODE_H:      return (modifiers & SHIFT_PRESSED) ? ASCII_H : ASCII_h;
		case SCANCODE_J:      return (modifiers & SHIFT_PRESSED) ? ASCII_J : ASCII_j;
		case SCANCODE_K:      return (modifiers & SHIFT_PRESSED) ? ASCII_K : ASCII_k;
		case SCANCODE_L:      return (modifiers & SHIFT_PRESSED) ? ASCII_L : ASCII_l;
		case SCANCODE_SEMICOLON: return (modifiers & SHIFT_PRESSED) ? ASCII_COLON : ASCII_SEMI_COLON;
		case SCANCODE_APOSTROPHE: return (modifiers & SHIFT_PRESSED) ? ASCII_DOUBLE_QUOTES : ASCII_SINGLE_QUOTE;
		case SCANCODE_BACKSLASH: return (modifiers & SHIFT_PRESSED) ? ASCII_VERT_BAR : ASCII_BACKSLASH;
		case SCANCODE_Z:      return (modifiers & SHIFT_PRESSED) ? ASCII_Z : ASCII_z;
		case SCANCODE_X:      return (modifiers & SHIFT_PRESSED) ? ASCII_X : ASCII_x;
		case SCANCODE_C:      return (modifiers & SHIFT_PRESSED) ? ASCII_C : ASCII_c;
		case SCANCODE_V:      return (modifiers & SHIFT_PRESSED) ? ASCII_V : ASCII_v;
		case SCANCODE_B:      return (modifiers & SHIFT_PRESSED) ? ASCII_B : ASCII_b;
		case SCANCODE_N:      return (modifiers & SHIFT_PRESSED) ? ASCII_N : ASCII_n;
		case SCANCODE_M:      return (modifiers & SHIFT_PRESSED) ? ASCII_M : ASCII_m;
		case SCANCODE_COMMA:  return (modifiers & SHIFT_PRESSED) ? ASCII_LESS : ASCII_COMMA;
		case SCANCODE_PERIOD: return (modifiers & SHIFT_PRESSED) ? ASCII_GREATER : ASCII_PERIOD;
		case SCANCODE_SLASH:  return (modifiers & SHIFT_PRESSED) ? ASCII_QUESTION_M : ASCII_SLASH;
		case SCANCODE_SPACE:  return ASCII_SPACE;
		case SCANCODE_LEFT:   return ASCII_CURSOR_LEFT;
		case SCANCODE_UP:     return ASCII_CURSOR_UP;
		case SCANCODE_DOWN:   return ASCII_CURSOR_DOWN;
		case SCANCODE_RIGHT:  return ASCII_CURSOR_RIGHT;
	}
	return ASCII_NULL;
}